

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O0

bool device_pick(float x,float y,ISPCCamera *camera,Vec3fa *hitPos)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  Ray1 ray;
  __m128 c;
  __m128 r;
  __m128 a;
  float local_644 [3];
  float local_638 [3];
  float local_62c [3];
  float local_620 [3];
  float local_614 [3];
  float local_608 [2];
  ulong uStack_600;
  undefined8 local_5f8;
  ulong uStack_5f0;
  undefined8 local_5e8;
  ulong uStack_5e0;
  float local_5d8;
  float fStack_5d4;
  undefined8 uStack_5d0;
  float local_5c8;
  undefined4 local_5c4;
  undefined1 auStack_5b8 [20];
  undefined4 local_5a4;
  int local_5a0;
  undefined8 *local_588;
  undefined1 local_574 [4];
  undefined1 local_570 [8];
  undefined8 *local_568;
  float *local_560;
  undefined8 *local_558;
  float *local_550;
  float *local_548;
  float *local_540;
  float *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  float local_51c;
  float *local_518;
  float *local_510;
  float local_504;
  float local_500;
  float local_4fc;
  float *local_4f8;
  float *local_4f0;
  float *local_4e8;
  float local_4dc;
  float local_4d8;
  float local_4d4;
  float *local_4d0;
  float *local_4c8;
  float *local_4c0;
  float local_4b4;
  float local_4b0;
  float local_4ac;
  float *local_4a8;
  undefined1 *local_4a0;
  float *local_498;
  float local_48c;
  float local_488;
  float local_484 [3];
  undefined1 *local_478;
  float *local_470;
  undefined8 *local_468;
  undefined1 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  float *local_3c0;
  undefined8 *local_3b8;
  undefined1 *local_3b0;
  float local_388;
  ulong uStack_380;
  float local_378;
  undefined4 local_36c;
  undefined8 local_368;
  ulong uStack_360;
  float local_358;
  float local_354;
  float local_350;
  undefined4 local_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float *local_270;
  float *local_268;
  float *local_260;
  float *local_258;
  float *local_250;
  float *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  ulong local_188;
  undefined8 uStack_180;
  float local_174;
  float *local_170;
  undefined1 local_168 [16];
  undefined4 local_14c;
  undefined1 local_148 [16];
  undefined4 local_12c;
  undefined1 local_128 [16];
  float local_10c;
  ulong local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_568 = &local_5e8;
  local_3c0 = &local_5d8;
  local_3b0 = auStack_5b8;
  local_560 = in_RDI + 9;
  local_558 = &local_5f8;
  local_350 = in_RDI[0xb];
  local_358 = *local_560;
  local_354 = in_RDI[10];
  local_368 = *(undefined8 *)local_560;
  local_34c = 0;
  uStack_360 = (ulong)(uint)local_350;
  local_4c8 = local_638;
  local_478 = local_570;
  local_484[0] = in_XMM0_Da * *in_RDI;
  local_260 = local_484;
  local_268 = &local_488;
  local_270 = &local_48c;
  local_4a8 = in_RDI + 3;
  local_4d0 = local_644;
  local_4a0 = local_574;
  local_4ac = in_XMM1_Da * *local_4a8;
  local_240 = &local_4ac;
  local_248 = &local_4b0;
  local_250 = &local_4b4;
  local_4f0 = local_62c;
  local_4d4 = local_484[0] + local_4ac;
  local_220 = &local_4d4;
  local_228 = &local_4d8;
  local_230 = &local_4dc;
  local_4f8 = in_RDI + 6;
  local_518 = local_620;
  local_4fc = local_4d4 + *local_4f8;
  local_200 = &local_4fc;
  local_208 = &local_500;
  local_210 = &local_504;
  local_550 = local_614;
  local_c = local_504 * local_504;
  local_18 = local_500 * local_500 + local_c;
  local_174 = local_4fc * local_4fc + local_18;
  local_128._4_4_ = 0;
  local_128._0_4_ = local_174;
  local_188 = local_128._0_8_;
  uStack_180 = 0;
  local_108 = local_128._0_8_;
  uStack_100 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_128._0_8_;
  local_198 = rsqrtss(auVar1,auVar1);
  local_12c = 0x3fc00000;
  local_148 = ZEXT416(0x3fc00000);
  local_58 = local_198._0_8_;
  uVar2 = local_58;
  uStack_50 = local_198._8_8_;
  local_58._0_4_ = local_198._0_4_;
  local_48 = (ulong)(uint)((float)local_58 * 1.5);
  uStack_40 = 0;
  local_14c = 0xbf000000;
  local_168 = ZEXT416(0xbf000000);
  local_78 = local_168._0_8_;
  uStack_70 = 0;
  local_68 = (ulong)(uint)(local_174 * -0.5);
  uStack_60 = 0;
  local_98 = local_198._0_8_;
  uStack_90 = local_198._8_8_;
  local_51c = local_174 * -0.5 * (float)local_58;
  local_88 = (ulong)(uint)local_51c;
  uStack_80 = 0;
  local_b8 = local_198._0_8_;
  uStack_b0 = local_198._8_8_;
  local_a8 = CONCAT44(local_198._4_4_,(float)local_58 * (float)local_58);
  uStack_a0 = local_198._8_8_;
  local_d8 = local_a8;
  uStack_d0 = local_198._8_8_;
  local_51c = local_51c * (float)local_58 * (float)local_58;
  local_c8 = (ulong)(uint)local_51c;
  uStack_c0 = 0;
  local_f8 = local_c8;
  uStack_f0 = 0;
  local_51c = (float)local_58 * 1.5 + local_51c;
  local_e8 = (ulong)(uint)local_51c;
  uStack_e0 = 0;
  local_1a8 = local_e8;
  uStack_1a0 = 0;
  local_38 = local_e8;
  uStack_30 = 0;
  local_1e0 = &local_51c;
  local_378 = local_4fc * local_51c;
  fVar3 = local_500 * local_51c;
  fVar4 = local_504 * local_51c;
  local_1b8 = &local_1e4;
  local_1c0 = &local_1e8;
  local_1c8 = &local_1ec;
  local_548 = local_608;
  fStack_5d4 = local_1e8;
  local_36c = 0;
  uStack_380 = (ulong)(uint)local_1ec;
  local_538 = &local_5d8;
  local_540 = local_608;
  local_468 = &local_5e8;
  uStack_5e0 = (ulong)(uint)local_350;
  local_460 = &embree::inf;
  local_588 = in_RSI;
  local_530 = local_558;
  local_528 = local_568;
  local_510 = local_550;
  local_504 = local_4dc + in_RDI[8];
  local_500 = local_4d8 + in_RDI[7];
  local_4e8 = local_518;
  local_4dc = local_48c + local_4b4;
  local_4d8 = local_488 + local_4b0;
  local_4c0 = local_4f0;
  local_4b4 = in_XMM1_Da * in_RDI[5];
  local_4b0 = in_XMM1_Da * in_RDI[4];
  local_498 = local_4d0;
  local_48c = in_XMM0_Da * in_RDI[2];
  local_488 = in_XMM0_Da * in_RDI[1];
  local_470 = local_4c8;
  local_3b8 = local_568;
  local_258 = local_4c8;
  local_238 = local_4d0;
  local_218 = local_4f0;
  local_1f8 = local_518;
  local_1ec = fVar4;
  local_1e8 = fVar3;
  local_1e4 = local_378;
  local_1d8 = local_518;
  local_1d0 = local_550;
  local_1b0 = local_550;
  local_170 = local_518;
  local_128 = ZEXT416((uint)local_174);
  local_10c = local_174;
  local_58 = uVar2;
  local_28 = local_518;
  local_20 = local_518;
  local_14 = local_4fc;
  local_10 = local_4fc;
  local_644[0] = local_4ac;
  local_638[0] = local_484[0];
  local_62c[0] = local_4d4;
  local_620[0] = local_4fc;
  local_614[0] = local_378;
  uStack_600 = uStack_380;
  local_5f8 = local_368;
  uStack_5f0 = uStack_360;
  local_5e8 = local_368;
  uStack_5d0 = uStack_380;
  local_5d8 = local_378;
  local_388 = local_378;
  local_608[0] = local_378;
  local_5c8 = std::numeric_limits<float>::infinity();
  local_5a0 = -1;
  local_5a4 = 0xffffffff;
  local_5c4 = 0xffffffff;
  local_458 = &local_5e8;
  uStack_5d0._4_4_ = g_debug;
  local_450 = &local_5e8;
  rtcIntersect1(embree::g_scene,local_450,0);
  if (local_5a0 != -1) {
    local_338 = (float)local_5e8;
    fStack_334 = (float)((ulong)local_5e8 >> 0x20);
    fStack_330 = (float)uStack_5e0;
    fStack_32c = (float)(uStack_5e0 >> 0x20);
    *local_588 = CONCAT44(fStack_334 + local_5c8 * fStack_5d4,local_338 + local_5c8 * local_5d8);
    local_588[1] = CONCAT44(fStack_32c + local_5c8 * uStack_5d0._4_4_,
                            fStack_330 + local_5c8 * (float)uStack_5d0);
  }
  else {
    *local_588 = 0;
    local_588[1] = 0;
  }
  return local_5a0 != -1;
}

Assistant:

bool device_pick(const float x,
                            const float y,
                            const ISPCCamera& camera,
                            Vec3fa& hitPos)
{
  /* initialize ray */
  Ray1 ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = g_debug;

  /* intersect ray with scene */
#if defined(__SYCL_DEVICE_ONLY__)
  rtcTraversableIntersect1(g_traversable,RTCRayHit1_(ray));
#else
  rtcIntersect1(g_scene,RTCRayHit1_(ray));
#endif

  /* shade pixel */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) {
    hitPos = Vec3fa(0.0f,0.0f,0.0f);
    return false;
  }
  else {
    hitPos = ray.org + ray.tfar*ray.dir;
    return true;
  }
}